

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O0

void duckdb::ReservoirQuantileListOperation<double>::
     Finalize<duckdb::list_entry_t,duckdb::ReservoirQuantileState<double>>
               (ReservoirQuantileState<double> *state,list_entry_t *target,
               AggregateFinalizeData *finalize_data)

{
  ReservoirQuantileBindData *pRVar1;
  Vector *vector;
  double *pdVar2;
  double dVar3;
  reference pvVar4;
  long lVar5;
  ulong uVar6;
  double *in_RSI;
  undefined8 *in_RDI;
  undefined1 auVar7 [16];
  idx_t offset;
  value_type *quantile;
  size_t q;
  list_entry_t *entry;
  double *v_t;
  double *rdata;
  idx_t ridx;
  Vector *result;
  ReservoirQuantileBindData *bind_data;
  Vector *in_stack_ffffffffffffff88;
  FunctionData *in_stack_ffffffffffffff90;
  double *__last;
  double *__first;
  AggregateFinalizeData *in_stack_ffffffffffffffd0;
  Vector *pVVar8;
  
  if (in_RDI[2] == 0) {
    AggregateFinalizeData::ReturnNull(in_stack_ffffffffffffffd0);
  }
  else {
    optional_ptr<duckdb::FunctionData,_true>::operator->
              ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_ffffffffffffff90);
    pRVar1 = FunctionData::Cast<duckdb::ReservoirQuantileBindData>(in_stack_ffffffffffffff90);
    ListVector::GetEntry((Vector *)0x1db69c6);
    vector = (Vector *)ListVector::GetListSize(in_stack_ffffffffffffff88);
    pVVar8 = vector;
    ::std::vector<double,_std::allocator<double>_>::size
              (&(pRVar1->quantiles).super_vector<double,_std::allocator<double>_>);
    ListVector::Reserve(vector,(idx_t)in_stack_ffffffffffffff88);
    pdVar2 = FlatVector::GetData<double>((Vector *)0x1db6a1e);
    __first = (double *)*in_RDI;
    *in_RSI = (double)pVVar8;
    dVar3 = (double)::std::vector<double,_std::allocator<double>_>::size
                              (&(pRVar1->quantiles).super_vector<double,_std::allocator<double>_>);
    in_RSI[1] = dVar3;
    for (__last = (double *)0x0; __last < (double *)in_RSI[1]; __last = (double *)((long)__last + 1)
        ) {
      pvVar4 = vector<double,_true>::operator[]
                         ((vector<double,_true> *)vector,(size_type)in_stack_ffffffffffffff88);
      lVar5 = in_RDI[2] + -1;
      auVar7._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar7._0_8_ = lVar5;
      auVar7._12_4_ = 0x45300000;
      dVar3 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) * *pvVar4;
      uVar6 = (ulong)dVar3;
      ::std::nth_element<double*>(__first,in_RSI,__last);
      pdVar2[(long)(&pVVar8->vector_type + (long)__last)] =
           __first[uVar6 | (long)(dVar3 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f];
    }
    ListVector::SetListSize(vector,(idx_t)in_stack_ffffffffffffff88);
  }
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.pos == 0) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->template Cast<ReservoirQuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		auto v_t = state.v;
		D_ASSERT(v_t);

		auto &entry = target;
		entry.offset = ridx;
		entry.length = bind_data.quantiles.size();
		for (size_t q = 0; q < entry.length; ++q) {
			const auto &quantile = bind_data.quantiles[q];
			auto offset = (idx_t)((double)(state.pos - 1) * quantile);
			std::nth_element(v_t, v_t + offset, v_t + state.pos);
			rdata[ridx + q] = v_t[offset];
		}

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}